

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void __thiscall
testing::internal::PairMatcherImpl<std::pair<unsigned_long_const,unsigned_long>const&>::
PairMatcherImpl<int,int>
          (PairMatcherImpl<std::pair<unsigned_long_const,unsigned_long>const&> *this,
          int first_matcher,int second_matcher)

{
  int local_20;
  int local_1c;
  
  *(undefined ***)this = &PTR__PairMatcherImpl_002d3d18;
  local_20 = second_matcher;
  local_1c = first_matcher;
  MatcherCastImpl<const_unsigned_long_&,_int>::CastImpl<true>(this + 8,&local_1c);
  MatcherCastImpl<const_unsigned_long_&,_int>::CastImpl<true>(this + 0x20,&local_20);
  return;
}

Assistant:

PairMatcherImpl(FirstMatcher first_matcher, SecondMatcher second_matcher)
      : first_matcher_(
            testing::SafeMatcherCast<const FirstType&>(first_matcher)),
        second_matcher_(
            testing::SafeMatcherCast<const SecondType&>(second_matcher)) {}